

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O3

CNetAddr * i2p::DestBinToAddr(CNetAddr *__return_storage_ptr__,Binary *dest)

{
  uchar *data;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  Span<const_unsigned_char> input;
  string addr_str;
  uchar hash [32];
  CSHA256 hasher;
  string local_108;
  string local_e8;
  uchar local_c8 [40];
  CSHA256 local_a0;
  CNetAddr *local_38;
  
  local_38 = *(CNetAddr **)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&local_a0);
  data = (dest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  CSHA256::Write(&local_a0,data,
                 (long)(dest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CSHA256::Finalize(&local_a0,local_c8);
  CNetAddr::CNetAddr(__return_storage_ptr__);
  input.m_size = 0x20;
  input.m_data = local_c8;
  EncodeBase32_abi_cxx11_(&local_108,input,false);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_108,".b32.i2p");
  local_e8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar2->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8._M_dataplus._M_p
      == args) {
    local_e8.field_2._M_allocated_capacity = *(undefined8 *)args;
    local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *(undefined8 *)args;
  }
  local_e8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)args;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  bVar1 = CNetAddr::SetSpecial(__return_storage_ptr__,&local_e8);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (*(CNetAddr **)(in_FS_OFFSET + 0x28) == local_38) {
      return *(CNetAddr **)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&local_108,(tinyformat *)"Cannot parse I2P address: \"%s\"",(char *)&local_e8,args);
    std::runtime_error::runtime_error(this,(string *)&local_108);
    if (*(CNetAddr **)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static CNetAddr DestBinToAddr(const Binary& dest)
{
    CSHA256 hasher;
    hasher.Write(dest.data(), dest.size());
    unsigned char hash[CSHA256::OUTPUT_SIZE];
    hasher.Finalize(hash);

    CNetAddr addr;
    const std::string addr_str = EncodeBase32(hash, false) + ".b32.i2p";
    if (!addr.SetSpecial(addr_str)) {
        throw std::runtime_error(strprintf("Cannot parse I2P address: \"%s\"", addr_str));
    }

    return addr;
}